

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexHull.cpp
# Opt level: O2

int above(cbtVector3 *vertices,cbtInt3 *t,cbtVector3 *p,cbtScalar epsilon)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 in_XMM1_Qb;
  undefined1 auVar4 [16];
  cbtVector3 cVar5;
  cbtVector3 cVar6;
  cbtScalar local_28;
  
  cVar5 = TriNormal(vertices + t->x,vertices + t->y,vertices + t->z);
  cVar6 = operator-(p,vertices + t->x);
  auVar3._8_8_ = extraout_XMM0_Qb;
  auVar3._0_8_ = cVar5.m_floats._0_8_;
  auVar4._0_4_ = cVar5.m_floats[0] * cVar6.m_floats[0];
  auVar4._4_4_ = cVar5.m_floats[1] * cVar6.m_floats[1];
  auVar4._8_4_ = (float)extraout_XMM0_Qb * (float)extraout_XMM0_Qb_00;
  auVar4._12_4_ =
       (float)((ulong)extraout_XMM0_Qb >> 0x20) * (float)((ulong)extraout_XMM0_Qb_00 >> 0x20);
  auVar4 = vmovshdup_avx(auVar4);
  auVar1._8_8_ = extraout_XMM0_Qb_00;
  auVar1._0_8_ = cVar6.m_floats._0_8_;
  auVar4 = vfmadd231ss_fma(auVar4,auVar3,auVar1);
  local_28 = cVar5.m_floats[2];
  auVar2._8_8_ = in_XMM1_Qb;
  auVar2._0_8_ = cVar6.m_floats._8_8_;
  auVar4 = vfmadd231ss_fma(auVar4,auVar2,ZEXT416((uint)local_28));
  return (int)(epsilon < auVar4._0_4_);
}

Assistant:

int above(cbtVector3 *vertices, const cbtInt3 &t, const cbtVector3 &p, cbtScalar epsilon)
{
	cbtVector3 n = TriNormal(vertices[t[0]], vertices[t[1]], vertices[t[2]]);
	return (cbtDot(n, p - vertices[t[0]]) > epsilon);  // EPSILON???
}